

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void HighsHashTree<int,_int>::mergeIntoLeaf<2>(InnerLeaf<2> *leaf,int hashPos,NodePtr mergeNode)

{
  Type TVar1;
  ListLeaf *pLVar2;
  InnerLeaf<1> *pIVar3;
  InnerLeaf<2> *pIVar4;
  InnerLeaf<3> *pIVar5;
  InnerLeaf<4> *pIVar6;
  InnerLeaf<2> *in_RDI;
  pair<int_*,_bool> pVar7;
  ListNode *next;
  ListNode *iter;
  ListLeaf *mergeLeaf;
  undefined8 in_stack_ffffffffffffff70;
  int hashPos_00;
  InnerLeaf<4> *in_stack_ffffffffffffff78;
  InnerLeaf<2> *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  undefined8 in_stack_ffffffffffffffc0;
  int hashPos_01;
  ListNode *pLVar8;
  uint64_t in_stack_ffffffffffffffc8;
  ListNode *fullHash;
  InnerLeaf<2> *in_stack_ffffffffffffffd0;
  NodePtr local_8;
  
  hashPos_01 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  hashPos_00 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  TVar1 = NodePtr::getType(&local_8);
  switch(TVar1) {
  case kListLeaf:
    pLVar2 = NodePtr::getListLeaf(&local_8);
    HighsHashTableEntry<int,_int>::key(&(pLVar2->first).entry);
    compute_hash((int *)0x56cfad);
    pVar7 = InnerLeaf<2>::insert_entry
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,hashPos_01,
                       (Entry *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
    pIVar4 = (InnerLeaf<2> *)pVar7.first;
    pLVar8 = (pLVar2->first).next;
    while (fullHash = pLVar8, fullHash != (ListNode *)0x0) {
      pLVar8 = fullHash->next;
      HighsHashTableEntry<int,_int>::key(&fullHash->entry);
      compute_hash((int *)0x56d034);
      pVar7 = InnerLeaf<2>::insert_entry
                        (pIVar4,(uint64_t)fullHash,(int)((ulong)pLVar8 >> 0x20),
                         (Entry *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffb8 = pVar7.second;
      if (fullHash != (ListNode *)0x0) {
        operator_delete(fullHash);
      }
    }
    break;
  case kInnerLeafSizeClass1:
    NodePtr::getInnerLeafSizeClass1(&local_8);
    HighsHashTree<int,int>::mergeIntoLeaf<2,1>
              (in_RDI,(InnerLeaf<1> *)in_stack_ffffffffffffff78,hashPos_00);
    pIVar3 = NodePtr::getInnerLeafSizeClass1(&local_8);
    if (pIVar3 != (InnerLeaf<1> *)0x0) {
      operator_delete(pIVar3);
    }
    break;
  case kInnerLeafSizeClass2:
    NodePtr::getInnerLeafSizeClass2(&local_8);
    HighsHashTree<int,int>::mergeIntoLeaf<2,2>
              (in_stack_ffffffffffffff80,(InnerLeaf<2> *)in_stack_ffffffffffffff78,
               (int)((ulong)in_RDI >> 0x20));
    pIVar4 = NodePtr::getInnerLeafSizeClass2(&local_8);
    if (pIVar4 != (InnerLeaf<2> *)0x0) {
      operator_delete(pIVar4);
    }
    break;
  case kInnerLeafSizeClass3:
    NodePtr::getInnerLeafSizeClass3(&local_8);
    HighsHashTree<int,int>::mergeIntoLeaf<2,3>
              (in_stack_ffffffffffffff80,(InnerLeaf<3> *)in_stack_ffffffffffffff78,hashPos_00);
    pIVar5 = NodePtr::getInnerLeafSizeClass3(&local_8);
    if (pIVar5 != (InnerLeaf<3> *)0x0) {
      operator_delete(pIVar5);
    }
    break;
  case kInnerLeafSizeClass4:
    NodePtr::getInnerLeafSizeClass4(&local_8);
    HighsHashTree<int,int>::mergeIntoLeaf<2,4>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,hashPos_00);
    pIVar6 = NodePtr::getInnerLeafSizeClass4(&local_8);
    if (pIVar6 != (InnerLeaf<4> *)0x0) {
      operator_delete(pIVar6);
    }
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass>* leaf, int hashPos,
                            NodePtr mergeNode) {
    switch (mergeNode.getType()) {
      case kListLeaf: {
        ListLeaf* mergeLeaf = mergeNode.getListLeaf();
        leaf->insert_entry(compute_hash(mergeLeaf->first.entry.key()), hashPos,
                           mergeLeaf->first.entry);
        ListNode* iter = mergeLeaf->first.next;
        while (iter != nullptr) {
          ListNode* next = iter->next;
          leaf->insert_entry(compute_hash(iter->entry.key()), hashPos,
                             iter->entry);
          delete iter;
          iter = next;
        }
        break;
      }
      case kInnerLeafSizeClass1:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass1(), hashPos);
        delete mergeNode.getInnerLeafSizeClass1();
        break;
      case kInnerLeafSizeClass2:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass2(), hashPos);
        delete mergeNode.getInnerLeafSizeClass2();
        break;
      case kInnerLeafSizeClass3:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass3(), hashPos);
        delete mergeNode.getInnerLeafSizeClass3();
        break;
      case kInnerLeafSizeClass4:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass4(), hashPos);
        delete mergeNode.getInnerLeafSizeClass4();
        break;
      default:
        break;
    }
  }